

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall GlobOpt::EndTrackCall(GlobOpt *this,Instr *instr)

{
  uint *puVar1;
  OpCode OVar2;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  Opnd *this_00;
  _func_int **pp_Var4;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  BasicBlock *pBVar12;
  Type *ppOVar13;
  StackSym *pSVar14;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a0,"(instr)","instr");
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  bVar6 = OpCodeAttr::CallInstr(instr->m_opcode);
  if ((!bVar6) &&
     ((uVar8 = instr->m_opcode - 0x248, 0x21 < uVar8 ||
      ((0x200000023U >> ((ulong)uVar8 & 0x3f) & 1) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a2,
                       "(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)"
                       ,
                       "OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee"
                      );
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  if ((this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a4,"(!this->isCallHelper)","!this->isCallHelper");
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  pSVar3 = (this->currentBlock->globOptData).callSequence;
  if ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar3->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a5,"(!this->currentBlock->globOptData.callSequence->Empty())",
                       "!this->currentBlock->globOptData.callSequence->Empty()");
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  pBVar12 = this->currentBlock;
  uVar10 = (pBVar12->globOptData).argOutCount;
  while( true ) {
    ppOVar13 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                         ((pBVar12->globOptData).callSequence);
    pSVar14 = IR::Opnd::GetStackSym(*ppOVar13);
    if (((*(uint *)&pSVar14->field_0x18 >> 0x15 | *(uint *)&pSVar14->field_0x18 >> 0x14) & 1) == 0)
    break;
    pBVar12 = this->currentBlock;
    puVar1 = &(pBVar12->globOptData).argOutCount;
    *puVar1 = *puVar1 - 1;
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
              ((pBVar12->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
    pBVar12 = this->currentBlock;
  }
  ppOVar13 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                       ((this->currentBlock->globOptData).callSequence);
  this_00 = *ppOVar13;
  OVar7 = IR::Opnd::GetKind(this_00);
  if (OVar7 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  pp_Var4 = this_00[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var4 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            ((this->currentBlock->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
  if (((ulong)pp_Var4[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b4,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  if (*(short *)(pp_Var4[5] + 0x30) != 7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b5,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                       "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
    if (!bVar6) goto LAB_00492f36;
    *puVar11 = 0;
  }
  uVar8 = 1;
  uVar9 = IR::Instr::GetArgOutCount((Instr *)pp_Var4[5],true);
  OVar2 = instr->m_opcode;
  if (((OVar2 != NewScObject) && (OVar2 != NewScObjArray)) && (OVar2 != NewScObjectSpread)) {
    uVar8 = (uint)(OVar2 == NewScObjArraySpread);
  }
  if (uVar9 != (uVar10 - (this->currentBlock->globOptData).argOutCount) + uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3bc,
                       "((uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread))"
                       ,
                       "(uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread)"
                      );
    if (!bVar6) {
LAB_00492f36:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar11 = 0;
  }
  uVar10 = IR::Instr::GetArgOutCount((Instr *)pp_Var4[5],true);
  pBVar12 = this->currentBlock;
  puVar1 = &(pBVar12->globOptData).totalOutParamCount;
  *puVar1 = *puVar1 - uVar10;
  puVar1 = &(pBVar12->globOptData).startCallCount;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

void GlobOpt::EndTrackCall(IR::Instr* instr)
{
    Assert(instr);
    Assert(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd
        || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee);

    Assert(!this->isCallHelper);
    Assert(!this->currentBlock->globOptData.callSequence->Empty());


#if DBG
    uint origArgOutCount = this->currentBlock->globOptData.argOutCount;
#endif
    while (this->currentBlock->globOptData.callSequence->Head()->GetStackSym()->HasArgSlotNum())
    {
        this->currentBlock->globOptData.argOutCount--;
        this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);
    }
    StackSym * sym = this->currentBlock->globOptData.callSequence->Head()->AsRegOpnd()->m_sym->AsStackSym();
    this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);

#if DBG
    Assert(sym->m_isSingleDef);
    Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

    // Number of argument set should be the same as indicated at StartCall
    // except NewScObject has an implicit arg1
    Assert((uint)sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true) ==
        origArgOutCount - this->currentBlock->globOptData.argOutCount +
           (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray
           || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread));

#endif

    this->currentBlock->globOptData.totalOutParamCount -= sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
    this->currentBlock->globOptData.startCallCount--;
}